

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DArrayCase::verify
          (TextureGather2DArrayCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  undefined7 extraout_var;
  Vec3 texCoords [4];
  Texture2DArrayView local_70;
  long local_60;
  undefined1 local_58 [8];
  undefined1 auStack_50 [16];
  float afStack_40 [2];
  undefined1 local_38 [24];
  
  local_38._0_4_ = 0.0;
  local_38._4_4_ = 0.0;
  local_38._8_4_ = 0.0;
  local_38._12_4_ = 0.0;
  auStack_50._8_4_ = 0.0;
  auStack_50._12_4_ = 0.0;
  afStack_40[0] = 0.0;
  afStack_40[1] = 0.0;
  local_58._0_4_ = 0.0;
  local_58._4_4_ = 0.0;
  auStack_50._0_4_ = 0.0;
  auStack_50._4_4_ = 0.0;
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            (&local_70,this,(ulong)ctx & 0xffffffff);
  lVar3 = 0;
  pvVar1 = (void *)CONCAT44(local_70._4_4_,local_70.m_numLevels);
  do {
    *(undefined4 *)(auStack_50 + lVar3) = *(undefined4 *)((long)pvVar1 + lVar3 + 8);
    *(undefined8 *)(local_58 + lVar3) = *(undefined8 *)((long)pvVar1 + lVar3);
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x30);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_60 - (long)pvVar1);
  }
  tcu::Texture2DArrayView::Texture2DArrayView
            (&local_70,1,
             (this->m_swizzledTexture).m_view.m_levels + (this->super_TextureGatherCase).m_baseLevel
            );
  bVar2 = Functional::(anonymous_namespace)::TextureGatherCase::
          verify<tcu::Texture2DArrayView,tcu::Vector<float,3>>
                    ((TextureGatherCase *)this,(ConstPixelBufferAccess *)sig,&local_70,
                     (Vector<float,_3> (*) [4])local_58,
                     &(this->m_iterations).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)ctx].gatherArgs);
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool TextureGather2DArrayCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec3 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::Texture2DArrayView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx].gatherArgs);
}